

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::solve1(btLCP *this,btScalar *a,int i,int dir,int only_transfer)

{
  int n;
  uint n_00;
  btScalar *pbVar1;
  int *piVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  n = this->m_nC;
  if (0 < (long)n) {
    pbVar1 = this->m_Dell;
    piVar2 = this->m_C;
    pbVar3 = this->m_A[i];
    uVar6 = 0;
    uVar5 = (ulong)(uint)this->m_nub;
    if (this->m_nub < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pbVar1[uVar6] = pbVar3[uVar6];
    }
    for (; uVar5 < (ulong)(long)n; uVar5 = uVar5 + 1) {
      pbVar1[uVar5] = pbVar3[piVar2[uVar5]];
    }
    btSolveL1(this->m_L,pbVar1,n,this->m_nskip);
    pbVar1 = this->m_ell;
    pbVar3 = this->m_Dell;
    pbVar4 = this->m_d;
    n_00 = this->m_nC;
    uVar6 = 0;
    uVar5 = 0;
    if (0 < (int)n_00) {
      uVar5 = (ulong)n_00;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pbVar1[uVar6] = pbVar3[uVar6] * pbVar4[uVar6];
    }
    if (only_transfer == 0) {
      pbVar3 = this->m_tmp;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pbVar3[uVar6] = pbVar1[uVar6];
      }
      btSolveL1T(this->m_L,pbVar3,n_00,this->m_nskip);
      uVar5 = 0;
      if (0 < this->m_nC) {
        uVar5 = (ulong)(uint)this->m_nC;
      }
      piVar2 = this->m_C;
      pbVar1 = this->m_tmp;
      uVar6 = 0;
      if (dir < 1) {
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          a[piVar2[uVar6]] = pbVar1[uVar6];
        }
      }
      else {
        for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          a[piVar2[uVar6]] = -pbVar1[uVar6];
        }
      }
    }
  }
  return;
}

Assistant:

void btLCP::solve1 (btScalar *a, int i, int dir, int only_transfer)
{
  // the `Dell' and `ell' that are computed here are saved. if index i is
  // later added to the factorization then they can be reused.
  //
  // @@@ question: do we need to solve for entire delta_x??? yes, but
  //     only if an x goes below 0 during the step.

  if (m_nC > 0) {
    {
      btScalar *Dell = m_Dell;
      int *C = m_C;
      btScalar *aptr = BTAROW(i);
#   ifdef BTNUB_OPTIMIZATIONS
      // if nub>0, initial part of aptr[] is guaranteed unpermuted
      const int nub = m_nub;
      int j=0;
      for ( ; j<nub; ++j) Dell[j] = aptr[j];
      const int nC = m_nC;
      for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
    }
    btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
    {
      btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) ell[j] = Dell[j] * d[j];
    }

    if (!only_transfer) {
      btScalar *tmp = m_tmp, *ell = m_ell;
      {
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) tmp[j] = ell[j];
      }
      btSolveL1T (m_L,tmp,m_nC,m_nskip);
      if (dir > 0) {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = -tmp[j];
      } else {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = tmp[j];
      }
    }
  }
}